

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void db_destroy_test_full_path(void)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  int iVar5;
  fdb_status fVar6;
  time_t tVar7;
  uint8_t *puVar8;
  size_t sVar9;
  size_t sVar10;
  fdb_config *fconfig;
  long lVar11;
  uint uVar12;
  char *info;
  kvs_ops_stat *pkVar13;
  char *pcVar14;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_ops_info *unaff_R12;
  code *unaff_R13;
  fdb_doc *pfVar16;
  char *info_00;
  ulong uVar17;
  btree *pbVar18;
  btree *pbVar19;
  bool bVar20;
  timeval tVar21;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char cmd [256];
  char path [256];
  int iStack_cdc;
  fdb_doc *pfStack_cd8;
  fdb_file_handle *pfStack_cd0;
  undefined4 uStack_cc8;
  undefined3 uStack_cc4;
  undefined1 uStack_cc1;
  fdb_kvs_handle *pfStack_cc0;
  uint uStack_cb4;
  timeval tStack_cb0;
  timeval tStack_ca0;
  timeval tStack_c90;
  fdb_file_info fStack_c80;
  char acStack_c38 [1032];
  fdb_config *pfStack_830;
  fdb_kvs_ops_info *pfStack_828;
  fdb_doc *pfStack_820;
  btree *pbStack_818;
  btree *pbStack_810;
  kvs_ops_stat *pkStack_808;
  btree *pbStack_7f8;
  fdb_kvs_handle *pfStack_7f0;
  fdb_doc *pfStack_7e8;
  fdb_iterator *pfStack_7e0;
  undefined8 uStack_7d8;
  fdb_kvs_handle *apfStack_7d0 [4];
  undefined1 auStack_7b0 [64];
  undefined1 auStack_770 [88];
  undefined1 auStack_718 [40];
  btree bStack_6f0;
  char acStack_6a0 [256];
  undefined1 auStack_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 auStack_580 [16];
  undefined1 auStack_570 [16];
  undefined1 auStack_560 [16];
  fdb_doc afStack_550 [3];
  fdb_config fStack_450;
  char *pcStack_358;
  undefined1 local_328 [24];
  fdb_config local_310;
  char local_218 [256];
  char local_118 [256];
  
  pbVar18 = (btree *)local_328;
  pbVar19 = (btree *)local_328;
  gettimeofday((timeval *)(local_328 + 8),(__timezone_ptr_t)0x0);
  memleak_start();
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  iVar5 = rand();
  sprintf(local_118,"/tmp/fdb_destroy_test_%d",(ulong)(uint)(iVar5 % 10000));
  sprintf(local_218,"rm -rf %s*",local_118);
  system(local_218);
  fdb_get_default_config();
  local_310.compaction_mode = '\x01';
  fdb_open((fdb_file_handle **)local_328,local_118,&local_310);
  fdb_close((fdb_file_handle *)local_328._0_8_);
  pcVar14 = local_118;
  fVar6 = fdb_destroy(local_118,&local_310);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    pcVar14 = "%s PASSED\n";
    if (db_destroy_test_full_path()::__test_pass != '\0') {
      pcVar14 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar14,"Database destroy (full path) test");
    return;
  }
  db_destroy_test_full_path();
  info = (char *)((ulong)pcVar14 & 0xffffffff);
  info_00 = (char *)0x0;
  pkStack_808 = (kvs_ops_stat *)0x112ad8;
  pcStack_358 = local_118;
  gettimeofday((timeval *)(auStack_718 + 0x18),(__timezone_ptr_t)0x0);
  pkStack_808 = (kvs_ops_stat *)0x112add;
  memleak_start();
  pfStack_7e8 = (fdb_doc *)auStack_5a0;
  auStack_7b0._0_16_ = (undefined1  [16])0x0;
  auStack_7b0._16_8_ = (void *)0x0;
  auStack_7b0._24_8_ = (kvs_info *)0x0;
  auStack_7b0._32_8_ = (kvs_ops_stat *)0x0;
  auStack_7b0._40_8_ = (fdb_file_handle *)0x0;
  auStack_7b0._48_8_ = (hbtrie *)0x0;
  auStack_5a0 = (undefined1  [16])0x0;
  auStack_590 = (undefined1  [16])0x0;
  auStack_570 = (undefined1  [16])0x0;
  auStack_580._8_8_ = 0;
  auStack_580._0_8_ = acStack_6a0;
  auStack_560._8_8_ = 0;
  auStack_560._0_8_ = afStack_550;
  pkStack_808 = (kvs_ops_stat *)0x112b44;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig = &fStack_450;
  pkStack_808 = (kvs_ops_stat *)0x112b54;
  fdb_get_default_config();
  pkStack_808 = (kvs_ops_stat *)0x112b61;
  fdb_get_default_kvs_config();
  fStack_450.buffercache_size = 0;
  fStack_450.seqtree_opt = '\x01';
  fStack_450.wal_threshold = 0x400;
  fStack_450.flags = 1;
  fStack_450.compaction_threshold = '\0';
  fStack_450.multi_kv_instances = SUB81(info,0);
  pkStack_808 = (kvs_ops_stat *)0x112b94;
  fdb_open((fdb_file_handle **)&pfStack_7f0,"./dummy1",fconfig);
  uStack_7d8._4_4_ = (int)pcVar14;
  if (uStack_7d8._4_4_ != 0) {
    fconfig = (fdb_config *)0x3;
    info_00 = (char *)0x18;
    pbVar18 = (btree *)(auStack_770 + 0x20);
    unaff_R12 = (fdb_kvs_ops_info *)auStack_718;
    unaff_R13 = logCallbackFunc;
    info = "operational_stats_test";
    do {
      pkStack_808 = (kvs_ops_stat *)0x112bdc;
      sprintf((char *)pbVar18,"kv%d",(ulong)fconfig & 0xffffffff);
      pkStack_808 = (kvs_ops_stat *)0x112bf4;
      fVar6 = fdb_kvs_open((fdb_file_handle *)pfStack_7f0,
                           (fdb_kvs_handle **)((long)apfStack_7d0 + (long)info_00),(char *)pbVar18,
                           (fdb_kvs_config *)unaff_R12);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
      pkStack_808 = (kvs_ops_stat *)0x112c0c;
      fVar6 = fdb_set_log_callback
                        (apfStack_7d0[(long)fconfig],logCallbackFunc,"operational_stats_test");
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113168;
      info_00 = (char *)&((btree *)((long)info_00 + -0x38))->aux;
      bVar20 = fconfig != (fdb_config *)0x0;
      fconfig = (fdb_config *)&fconfig[-1].field_0xf7;
    } while (bVar20);
    auStack_7b0._56_8_ = (btree *)0x3;
LAB_00112c66:
    puVar8 = &((btree *)auStack_7b0._56_8_)->vsize;
    info = auStack_770 + 0x20;
    fconfig = (fdb_config *)auStack_7b0;
    info_00 = (char *)0x0;
    do {
      pkStack_808 = (kvs_ops_stat *)0x112ca2;
      sprintf(acStack_6a0,"key%d",(ulong)info_00 & 0xffffffff);
      unaff_R13 = (code *)afStack_550;
      pkStack_808 = (kvs_ops_stat *)0x112cbe;
      sprintf((char *)unaff_R13,"body%d",(ulong)info_00 & 0xffffffff);
      unaff_R12 = (fdb_kvs_ops_info *)(&bStack_6f0.ksize + (long)info_00 * 8);
      pkStack_808 = (kvs_ops_stat *)0x112cd1;
      sVar9 = strlen(acStack_6a0);
      pkStack_808 = (kvs_ops_stat *)0x112cdd;
      sVar10 = strlen((char *)unaff_R13);
      pkStack_808 = (kvs_ops_stat *)0x112cff;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_6a0,sVar9 + 1,(void *)0x0,0,unaff_R13,sVar10 + 1)
      ;
      info_00 = (char *)((long)info_00 + 1);
      pbVar18 = (btree *)puVar8;
      do {
        pkStack_808 = (kvs_ops_stat *)0x112d15;
        fVar6 = fdb_set((fdb_kvs_handle *)(&uStack_7d8)[(long)pbVar18],
                        (fdb_doc *)unaff_R12->num_sets);
        if (fVar6 != FDB_RESULT_SUCCESS) {
          pkStack_808 = (kvs_ops_stat *)0x1130fe;
          operational_stats_test();
LAB_001130fe:
          pkStack_808 = (kvs_ops_stat *)0x113103;
          operational_stats_test();
LAB_00113103:
          pkStack_808 = (kvs_ops_stat *)0x113115;
          operational_stats_test();
          goto LAB_00113115;
        }
        pkStack_808 = (kvs_ops_stat *)0x112d2a;
        fVar6 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_7d8)[(long)pbVar18],(fdb_kvs_ops_info *)info);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001130fe;
        auStack_7b0._0_8_ = info_00;
        pkStack_808 = (kvs_ops_stat *)0x112d47;
        iVar5 = bcmp(info,fconfig,0x38);
        if (iVar5 != 0) goto LAB_00113103;
        pbVar19 = (btree *)((long)&pbVar18[-1].aux + 7);
        bVar20 = 0 < (long)pbVar18;
        pbVar18 = pbVar19;
      } while (pbVar19 != (btree *)0x0 && bVar20);
    } while (info_00 != (char *)0xa);
    info_00 = auStack_770 + 0x20;
    pbStack_7f8 = (btree *)auStack_7b0._56_8_;
    do {
      pkStack_808 = (kvs_ops_stat *)0x112d98;
      fdb_iterator_init(apfStack_7d0[(long)pbStack_7f8],&pfStack_7e0,(void *)0x0,0,(void *)0x0,0,0);
      pbVar18 = &bStack_6f0;
      pfVar16 = (fdb_doc *)unaff_R13;
      do {
        pkStack_808 = (kvs_ops_stat *)0x112daf;
        fVar6 = fdb_iterator_get(pfStack_7e0,&pfStack_7e8);
        unaff_R13 = (code *)pfStack_7e8;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113131;
        fconfig = (fdb_config *)pfStack_7e8->key;
        unaff_R12 = *(fdb_kvs_ops_info **)pbVar18;
        info = (char *)unaff_R12->num_gets;
        pkStack_808 = (kvs_ops_stat *)0x112dd7;
        iVar5 = bcmp(fconfig,info,pfStack_7e8->keylen);
        if (iVar5 != 0) goto LAB_00113136;
        fconfig = (fdb_config *)((fdb_doc *)unaff_R13)->body;
        info = (char *)unaff_R12[1].num_dels;
        pkStack_808 = (kvs_ops_stat *)0x112df7;
        iVar5 = bcmp(fconfig,info,((fdb_doc *)unaff_R13)->bodylen);
        if (iVar5 != 0) goto LAB_00113158;
        pkStack_808 = (kvs_ops_stat *)0x112e11;
        fVar6 = fdb_get_kvs_ops_info(apfStack_7d0[(long)pbStack_7f8],(fdb_kvs_ops_info *)info_00);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113141;
        auStack_7b0._40_8_ = (long)(fdb_kvs_handle **)auStack_7b0._40_8_ + 1;
        auStack_7b0._48_8_ = auStack_7b0._48_8_ + 1;
        pkStack_808 = (kvs_ops_stat *)0x112e3f;
        iVar5 = bcmp(info_00,auStack_7b0,0x38);
        if (iVar5 != 0) goto LAB_00113146;
        pkStack_808 = (kvs_ops_stat *)0x112e51;
        fVar6 = fdb_iterator_next(pfStack_7e0);
        pbVar18 = (btree *)&pbVar18->root_bid;
        pfVar16 = (fdb_doc *)unaff_R13;
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      auStack_7b0._48_8_ = auStack_7b0._48_8_ + 1;
      pkStack_808 = (kvs_ops_stat *)0x112e70;
      fdb_iterator_close(pfStack_7e0);
      pkStack_808 = (kvs_ops_stat *)0x112e7f;
      fdb_commit((fdb_file_handle *)pfStack_7f0,'\x01');
      auStack_7b0._16_8_ = (void *)(auStack_7b0._16_8_ + 1);
      pkStack_808 = (kvs_ops_stat *)0x112e96;
      fVar6 = fdb_get_kvs_ops_info(apfStack_7d0[(long)pbStack_7f8],(fdb_kvs_ops_info *)info_00);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113184;
      pkStack_808 = (kvs_ops_stat *)0x112eb0;
      iVar5 = bcmp(info_00,auStack_7b0,0x38);
      if (iVar5 != 0) goto LAB_00113172;
    } while ((pbStack_7f8 != (btree *)0x0) &&
            (auStack_7b0._40_8_ = (fdb_file_handle *)0x0, auStack_7b0._48_8_ = (hbtrie *)0x0,
            bVar20 = 0 < (long)pbStack_7f8, pbStack_7f8 = (btree *)((long)&pbStack_7f8[-1].aux + 7),
            bVar20));
    auStack_7b0._24_8_ = auStack_7b0._24_8_ + 1;
    pkStack_808 = (kvs_ops_stat *)0x112ee9;
    fdb_compact((fdb_file_handle *)pfStack_7f0,"./dummy2");
    pkStack_808 = (kvs_ops_stat *)0x112efb;
    fVar6 = fdb_get_kvs_ops_info(apfStack_7d0[0],(fdb_kvs_ops_info *)(auStack_770 + 0x20));
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113189;
    pkStack_808 = (kvs_ops_stat *)0x112f1a;
    iVar5 = bcmp(auStack_770 + 0x20,auStack_7b0,0x38);
    info_00 = (char *)auStack_7b0._56_8_;
    if (iVar5 == 0) {
      pbVar18 = (btree *)(auStack_7b0._56_8_ + 1);
      unaff_R12 = (fdb_kvs_ops_info *)(auStack_770 + 0x20);
      unaff_R13 = (code *)auStack_7b0;
      pkVar13 = (kvs_ops_stat *)0x0;
      do {
        fconfig = (fdb_config *)((ulong)pkVar13 & 0xffffffff);
        pkStack_808 = (kvs_ops_stat *)0x112f56;
        sprintf(acStack_6a0,"key%d",(ulong)pkVar13 & 0xffffffff);
        info = (char *)((long)&(pkVar13->num_sets).super___atomic_base<unsigned_long>._M_i + 1);
        info_00 = (char *)pbVar18;
        do {
          if (((ulong)pkVar13 & 1) == 0) {
            if (((ulong)pkVar13 & 2) == 0) {
              pkStack_808 = (kvs_ops_stat *)0x112f75;
              fVar6 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],pfStack_7e8);
            }
            else {
              pfStack_7e8->seqnum = (fdb_seqnum_t)info;
              pkStack_808 = (kvs_ops_stat *)0x112f9b;
              fVar6 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],pfStack_7e8);
            }
          }
          else {
            pkStack_808 = (kvs_ops_stat *)0x112f86;
            fVar6 = fdb_get((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],pfStack_7e8);
          }
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113115;
          pkStack_808 = (kvs_ops_stat *)0x112fb0;
          fVar6 = fdb_get_kvs_ops_info((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],unaff_R12);
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011311a;
          pkStack_808 = (kvs_ops_stat *)0x112fcd;
          auStack_7b0._32_8_ = info;
          iVar5 = bcmp(unaff_R12,unaff_R13,0x38);
          if (iVar5 != 0) goto LAB_0011311f;
          pbVar19 = (btree *)((long)&((btree *)((long)info_00 + -0x38))->aux + 7);
          bVar20 = 0 < (long)info_00;
          info_00 = (char *)pbVar19;
        } while (pbVar19 != (btree *)0x0 && bVar20);
        pkVar13 = (kvs_ops_stat *)info;
      } while ((kvs_ops_stat *)info != (kvs_ops_stat *)0xa);
      fconfig = (fdb_config *)auStack_770;
      pbVar18 = (btree *)&stderr;
      info_00 = "%d:\t%u\t%u\t%u\t%lu\n";
      info = (char *)0x0;
      while( true ) {
        auStack_770._0_16_ = (undefined1  [16])0x0;
        auStack_770._16_8_ = (docio_handle *)0x0;
        pkStack_808 = (kvs_ops_stat *)0x113029;
        fVar6 = fdb_get_latency_stats
                          ((fdb_file_handle *)pfStack_7f0,(fdb_latency_stat *)fconfig,
                           (fdb_latency_stat_type)info);
        if (fVar6 != FDB_RESULT_SUCCESS) break;
        pkStack_808 = (kvs_ops_stat *)0x11305e;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",info);
        uVar12 = (int)info + 1;
        info = (char *)(ulong)uVar12;
        if (uVar12 == 0x13) {
          pkStack_808 = (kvs_ops_stat *)0x11306f;
          fdb_close((fdb_file_handle *)pfStack_7f0);
          lVar11 = 0;
          do {
            pkStack_808 = (kvs_ops_stat *)0x11307e;
            fdb_doc_free(*(fdb_doc **)(&bStack_6f0.ksize + lVar11 * 8));
            lVar11 = lVar11 + 1;
          } while (lVar11 != 10);
          pkStack_808 = (kvs_ops_stat *)0x11308c;
          fdb_shutdown();
          pkStack_808 = (kvs_ops_stat *)0x113091;
          memleak_end();
          pcVar14 = "single kv instance";
          if (uStack_7d8._4_1_ != '\0') {
            pcVar14 = "multiple kv instances";
          }
          pkStack_808 = (kvs_ops_stat *)0x1130c1;
          sprintf((char *)afStack_550,"Operational stats test %s",pcVar14);
          pcVar14 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pkStack_808 = (kvs_ops_stat *)0x1130e7;
          fprintf(_stderr,pcVar14,afStack_550);
          return;
        }
      }
      goto LAB_00113163;
    }
    goto LAB_0011318e;
  }
  pkStack_808 = (kvs_ops_stat *)0x112c3c;
  pfVar15 = pfStack_7f0;
  fVar6 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_7f0,apfStack_7d0,(fdb_kvs_config *)auStack_718);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pkStack_808 = (kvs_ops_stat *)0x112c5c;
    pfVar15 = apfStack_7d0[0];
    fVar6 = fdb_set_log_callback(apfStack_7d0[0],logCallbackFunc,"operational_stats_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001131a5;
    auStack_7b0._56_8_ = (btree *)0x0;
    goto LAB_00112c66;
  }
  goto LAB_001131a0;
LAB_00113115:
  pkStack_808 = (kvs_ops_stat *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pkStack_808 = (kvs_ops_stat *)0x11311f;
  operational_stats_test();
LAB_0011311f:
  pkStack_808 = (kvs_ops_stat *)0x113131;
  operational_stats_test();
  pfVar16 = (fdb_doc *)unaff_R13;
LAB_00113131:
  unaff_R13 = (code *)pfVar16;
  pkStack_808 = (kvs_ops_stat *)0x113136;
  operational_stats_test();
LAB_00113136:
  pkStack_808 = (kvs_ops_stat *)0x113141;
  operational_stats_test();
LAB_00113141:
  pkStack_808 = (kvs_ops_stat *)0x113146;
  operational_stats_test();
LAB_00113146:
  pkStack_808 = (kvs_ops_stat *)0x113158;
  operational_stats_test();
LAB_00113158:
  pkStack_808 = (kvs_ops_stat *)0x113163;
  operational_stats_test();
LAB_00113163:
  pkStack_808 = (kvs_ops_stat *)0x113168;
  operational_stats_test();
LAB_00113168:
  pkStack_808 = (kvs_ops_stat *)0x11316d;
  operational_stats_test();
LAB_0011316d:
  pkStack_808 = (kvs_ops_stat *)0x113172;
  operational_stats_test();
LAB_00113172:
  pkStack_808 = (kvs_ops_stat *)0x113184;
  operational_stats_test();
LAB_00113184:
  pkStack_808 = (kvs_ops_stat *)0x113189;
  operational_stats_test();
LAB_00113189:
  pkStack_808 = (kvs_ops_stat *)0x11318e;
  operational_stats_test();
LAB_0011318e:
  pfVar15 = (fdb_kvs_handle *)auStack_7b0;
  pkStack_808 = (kvs_ops_stat *)0x1131a0;
  operational_stats_test();
LAB_001131a0:
  pkStack_808 = (kvs_ops_stat *)0x1131a5;
  operational_stats_test();
  pbVar19 = pbVar18;
LAB_001131a5:
  pkStack_808 = (kvs_ops_stat *)_worker_thread;
  operational_stats_test();
  pfStack_830 = fconfig;
  pfStack_828 = unaff_R12;
  pfStack_820 = (fdb_doc *)unaff_R13;
  pbStack_818 = (btree *)info_00;
  pbStack_810 = pbVar19;
  pkStack_808 = (kvs_ops_stat *)info;
  gettimeofday(&tStack_c90,(__timezone_ptr_t)0x0);
  pfStack_cd8 = (fdb_doc *)0x0;
  sprintf(acStack_c38,"dummy%d",(ulong)*(uint *)&pfVar15->file->filename);
  fdb_open(&pfStack_cd0,acStack_c38,(fdb_config *)pfVar15->btreeblkops);
  fdb_kvs_open_default(pfStack_cd0,&pfStack_cc0,(fdb_kvs_config *)pfVar15->fileops);
  fVar6 = fdb_set_log_callback(pfStack_cc0,logCallbackFunc,"worker_thread");
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
  *(int *)(pfVar15->field_6).seqtree = *(int *)(pfVar15->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
    pbVar18 = (pfVar15->field_6).seqtree;
    iVar5._0_1_ = pbVar18->ksize;
    iVar5._1_1_ = pbVar18->vsize;
    iVar5._2_2_ = pbVar18->height;
    if ((list *)(pfVar15->kvs_config).custom_cmp == (list *)(long)iVar5) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
  gettimeofday((timeval *)&tStack_ca0,(__timezone_ptr_t)0x0);
  uStack_cc1 = 0;
  uVar17 = 0;
  iStack_cdc = 0;
  do {
    iVar5 = rand();
    iVar5 = (int)((ulong)(long)iVar5 % (ulong)(pfVar15->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar15->op_stats->num_sets)[iVar5].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_cd8,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar6 = fdb_get(pfStack_cc0,pfStack_cd8);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_cd8->body;
    plVar3 = *(long **)((&pfVar15->op_stats->num_sets)[iVar5].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar15->kvs != (kvs_info *)0x0) {
      uStack_cc8 = (undefined4)plVar2[1];
      uStack_cc4 = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar5 = atoi((char *)&uStack_cc8);
      sprintf((char *)&uStack_cc8,"%0 7d",(ulong)(iVar5 + 1));
      pvVar4 = pfStack_cd8->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_cc4,uStack_cc8._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_cc8;
      fVar6 = fdb_set(pfStack_cc0,pfStack_cd8);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar15->trie != (hbtrie *)0x0) && (uVar17 % (ulong)pfVar15->trie == 0)) {
        fdb_commit(pfStack_cd0,'\0');
        iStack_cdc = iStack_cdc + 1;
        fdb_get_file_info(pfStack_cd0,&fStack_c80);
        if ((pfVar15->staletree == (btree *)(long)iStack_cdc) &&
           (((pfVar15->staletree != (btree *)0x0 && (fStack_c80.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar15->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
          uStack_cb4 = *(int *)&pfVar15->file->filename + 1;
          *(uint *)&pfVar15->file->filename = uStack_cb4;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
          iStack_cdc = 0;
          sprintf(acStack_c38,"dummy%d",(ulong)uStack_cb4);
          fVar6 = fdb_compact(pfStack_cd0,acStack_c38);
          if (fVar6 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
            *(int *)&pfVar15->file->filename = *(int *)&pfVar15->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_cd8);
    pfStack_cd8 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
    gettimeofday((timeval *)&tStack_cb0,(__timezone_ptr_t)0x0);
    tVar21 = _utime_gap(tStack_ca0,tStack_cb0);
  } while ((fdb_file_handle *)tVar21.tv_sec < pfVar15->fhandle);
  pcVar14 = "writer";
  if (pfVar15->kvs == (kvs_info *)0x0) {
    pcVar14 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar15->kvs_config,pcVar14,
         uVar17 & 0xffffffff);
  pfVar15->bhandle = (btreeblk_handle *)(uVar17 & 0xffffffff);
  fdb_commit(pfStack_cd0,'\x01');
  fdb_kvs_close(pfStack_cc0);
  fdb_close(pfStack_cd0);
  pthread_exit((void *)0x0);
}

Assistant:

void db_destroy_test_full_path()
{
    TEST_INIT();

    memleak_start();
    randomize();

    int r;
    fdb_file_handle *dbfile;
    fdb_config config;
    fdb_status s;
    char path[256];
    char cmd[256];

    sprintf(path, "/tmp/fdb_destroy_test_%d", random(10000));

    sprintf(cmd, "rm -rf %s*", path);
    r = system(cmd); (void)r;

    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;

    fdb_open(&dbfile, path, &config);
    fdb_close(dbfile);

    s = fdb_destroy(path, &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database destroy (full path) test");
}